

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *table)

{
  int iVar1;
  ImGuiTableColumn *pIVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  
  iVar1 = table->ColumnsCount;
  if (0 < (long)iVar1) {
    pIVar2 = (table->Columns).Data;
    lVar3 = (long)iVar1 * 0x68;
    fVar5 = 0.0;
    fVar6 = 0.0;
    lVar4 = 0;
    do {
      if (((&pIVar2->IsEnabled)[lVar4] == true) &&
         ((*(byte *)((long)&pIVar2->Flags + lVar4) & 8) != 0)) {
        fVar5 = fVar5 + *(float *)((long)&pIVar2->StretchWeight + lVar4);
        fVar6 = fVar6 + *(float *)((long)&pIVar2->WidthRequest + lVar4);
      }
      lVar4 = lVar4 + 0x68;
    } while (lVar3 - lVar4 != 0);
    if (0 < iVar1) {
      pIVar2 = (table->Columns).Data;
      lVar4 = 0;
      do {
        if (((&pIVar2->IsEnabled)[lVar4] == true) &&
           ((*(byte *)((long)&pIVar2->Flags + lVar4) & 8) != 0)) {
          *(float *)((long)&pIVar2->StretchWeight + lVar4) =
               fVar5 * (*(float *)((long)&pIVar2->WidthRequest + lVar4) / fVar6);
        }
        lVar4 = lVar4 + 0x68;
      } while (lVar3 - lVar4 != 0);
    }
  }
  return;
}

Assistant:

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable* table)
{
    IM_ASSERT(table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1);

    // Measure existing quantity
    float visible_weight = 0.0f;
    float visible_width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        IM_ASSERT(column->StretchWeight > 0.0f);
        visible_weight += column->StretchWeight;
        visible_width += column->WidthRequest;
    }
    IM_ASSERT(visible_weight > 0.0f && visible_width > 0.0f);

    // Apply new weights
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        column->StretchWeight = (column->WidthRequest / visible_width) * visible_weight;
        IM_ASSERT(column->StretchWeight > 0.0f);
    }
}